

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O3

bool P_PredictLine(line_t_conflict *line,AActor *mo,int side,int activationType)

{
  bool bVar1;
  int iVar2;
  
  if ((line->special == 0xd7) || (line->special == 0x46)) {
    bVar1 = P_TestActivateLine(line,mo,side,activationType,(DVector3 *)0x0);
    if (!bVar1) {
      return false;
    }
    if ((cl_predict_specials.Value == true) && (line->locknumber < 1)) {
      iVar2 = P_ExecuteSpecial(line->special,(line_t *)line,mo,side == 1,line->args[0],line->args[1]
                               ,line->args[2],line->args[3],line->args[4]);
      if (iVar2 == 0) {
        return true;
      }
      if (developer.Value < 4) {
        return true;
      }
      Printf("Line special %d predicted on line %i\n",(ulong)(byte)line->special,
             (ulong)(uint)((int)((ulong)((long)line - (long)lines) >> 3) * 0x286bca1b));
      return true;
    }
  }
  return false;
}

Assistant:

bool P_PredictLine(line_t *line, AActor *mo, int side, int activationType)
{
	int lineActivation;
	INTBOOL buttonSuccess;
	BYTE special;

	// Only predict a very specifc section of specials
	if (line->special != Teleport_Line &&
		line->special != Teleport)
	{
		return false;
	}

	if (!P_TestActivateLine(line, mo, side, activationType) || !cl_predict_specials)
	{
		return false;
	}

	if (line->locknumber > 0) return false;
	lineActivation = line->activation;
	buttonSuccess = false;
	buttonSuccess = P_ExecuteSpecial(line->special,
		line, mo, side == 1, line->args[0],
		line->args[1], line->args[2],
		line->args[3], line->args[4]);

	special = line->special;

	// end of changed code
	if (developer >= DMSG_SPAMMY && buttonSuccess)
	{
		Printf("Line special %d predicted on line %i\n", special, int(line - lines));
	}
	return true;
}